

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parseInvalidIntegerLiteralTest_Test::TestBody
          (OpenDDLParserTest_parseInvalidIntegerLiteralTest_Test *this)

{
  size_t sVar1;
  char *pcVar2;
  AssertHelper AStack_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char token1 [2];
  AssertionResult gtest_ar;
  Value *data;
  char *out;
  char *in;
  
  data = (Value *)0x0;
  token1[0] = '1';
  token1[1] = '\0';
  sVar1 = strlen(token1);
  in = token1;
  out = OpenDDLParser::parseIntegerLiteral(token1,token1 + sVar1,&data,ddl_float);
  testing::internal::CmpHelperEQ<char*,char*>((internal *)&gtest_ar,"out","in",&out,&in);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<ODDLParser::Value>
            ((EqHelper<true> *)&gtest_ar,"nullptr","data",(Secret *)0x0,data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseInvalidIntegerLiteralTest) {
    size_t len1(0);
    Value *data(nullptr);
    char token1[] = "1", *end1(findEnd(token1, len1));
    char *in(token1);
    char *out = OpenDDLParser::parseIntegerLiteral(token1, end1, &data, Value::ValueType::ddl_float);
    EXPECT_EQ(out, in);
    ASSERT_EQ(nullptr, data);
}